

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void __thiscall
bloaty::anon_unknown_0::ElfFile::StructReader::Memcpy<Elf64_Phdr>
          (StructReader *this,uint64_t offset,string_view *out_range,Elf64_Phdr *out)

{
  const_pointer pvVar1;
  void *in_RCX;
  size_t *in_RDX;
  long in_RSI;
  size_t in_RDI;
  string_view sVar2;
  string_view range;
  char *in_stack_ffffffffffffffd0;
  char *local_28;
  
  sVar2._M_str = in_stack_ffffffffffffffd0;
  sVar2._M_len = *(size_t *)(in_RDI + 0x10);
  sVar2 = StrictSubstr(sVar2,*(size_t *)(in_RDI + 8),in_RDI);
  local_28 = sVar2._M_str;
  if (in_RDX != (size_t *)0x0) {
    *in_RDX = sVar2._M_len;
    in_RDX[1] = (size_t)local_28;
  }
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8));
  memcpy(in_RCX,pvVar1 + in_RSI,0x38);
  return;
}

Assistant:

void Memcpy(uint64_t offset, std::string_view* out_range, T* out) const {
      std::string_view range = StrictSubstr(data_, offset, sizeof(*out));
      if (out_range) {
        *out_range = range;
      }
      memcpy(out, data_.data() + offset, sizeof(*out));
    }